

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_magma_mac_signctx_init(EVP_PKEY_CTX *ctx,EVP_MD_CTX *mctx)

{
  void *pvVar1;
  EVP_PKEY_CTX *in_RDI;
  gost_mac_pmeth_data *data;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  if (pvVar1 == (void *)0x0) {
    pkey_gost_omac_init((EVP_PKEY_CTX *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(size_t)in_RDI
                       );
  }
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  if (pvVar1 == (void *)0x0) {
    ERR_GOST_error(0,0,in_stack_ffffffffffffffd8,0);
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static int pkey_gost_magma_mac_signctx_init(EVP_PKEY_CTX *ctx, EVP_MD_CTX *mctx)
{
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);

    if (data == NULL) {
        pkey_gost_omac_init(ctx, 4);
    }

    data = EVP_PKEY_CTX_get_data(ctx);
    if (!data) {
        GOSTerr(GOST_F_PKEY_GOST_MAGMA_MAC_SIGNCTX_INIT, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    return 1;
}